

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O1

void psocks_pw_check(void *ctx,pollwrapper *pw)

{
  uint uVar1;
  __pid_t _Var2;
  int status;
  int local_c;
  
  if ((-1 < signalpipe[0]) && (uVar1 = pollwrap_get_fd_rwx(pw,signalpipe[0]), (uVar1 & 1) != 0)) {
    do {
      _Var2 = waitpid(-1,&local_c,1);
      if ((0 < _Var2) && (_Var2 == subcommand_pid)) {
        still_running = 1;
      }
    } while (0 < _Var2);
  }
  return;
}

Assistant:

static void psocks_pw_check(void *ctx, pollwrapper *pw)
{
    if (signalpipe[0] >= 0 &&
        pollwrap_check_fd_rwx(pw, signalpipe[0], SELECT_R)) {
        while (true) {
            int status;
            pid_t pid = waitpid(-1, &status, WNOHANG);
            if (pid <= 0)
                break;
            if (pid == subcommand_pid)
                still_running = false;
        }
    }
}